

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

int testing::internal::AppropriateResolution<float>(float val)

{
  float local_1c;
  float local_18;
  float divfor6;
  float mulfor6;
  int full;
  float val_local;
  
  mulfor6 = val;
  if (val < 0.0) {
    mulfor6 = -val;
  }
  if (1e+06 <= mulfor6) {
    if (mulfor6 < 1e+10) {
      local_1c = 1.0;
      if (mulfor6 < 1e+09) {
        if (mulfor6 < 1e+08) {
          if (mulfor6 < 1e+07) {
            if (1e+06 <= mulfor6) {
              local_1c = 10.0;
            }
          }
          else {
            local_1c = 100.0;
          }
        }
        else {
          local_1c = 1000.0;
        }
      }
      else {
        local_1c = 10000.0;
      }
      local_1c = (float)(int)(mulfor6 / local_1c + 0.5) * local_1c;
      if ((local_1c == mulfor6) && (!NAN(local_1c) && !NAN(mulfor6))) {
        return 6;
      }
    }
  }
  else {
    local_18 = 1e+10;
    if (mulfor6 < 100000.0) {
      if (mulfor6 < 10000.0) {
        if (mulfor6 < 1000.0) {
          if (mulfor6 < 100.0) {
            if (mulfor6 < 10.0) {
              if (mulfor6 < 1.0) {
                if (mulfor6 < 0.1) {
                  if (mulfor6 < 0.01) {
                    if (mulfor6 < 0.001) {
                      if (0.0001 <= mulfor6) {
                        local_18 = 1e+09;
                      }
                    }
                    else {
                      local_18 = 1e+08;
                    }
                  }
                  else {
                    local_18 = 1e+07;
                  }
                }
                else {
                  local_18 = 1e+06;
                }
              }
              else {
                local_18 = 100000.0;
              }
            }
            else {
              local_18 = 10000.0;
            }
          }
          else {
            local_18 = 1000.0;
          }
        }
        else {
          local_18 = 100.0;
        }
      }
      else {
        local_18 = 10.0;
      }
    }
    else {
      local_18 = 1.0;
    }
    local_18 = (float)(int)(mulfor6 * local_18 + 0.5) / local_18;
    if ((local_18 == mulfor6) && (!NAN(local_18) && !NAN(mulfor6))) {
      return 6;
    }
  }
  return 9;
}

Assistant:

int AppropriateResolution(FloatType val) {
  int full = std::numeric_limits<FloatType>::max_digits10;
  if (val < 0) val = -val;

  if (val < 1000000) {
    FloatType mulfor6 = 1e10;
    if (val >= 100000.0) {  // 100,000 to 999,999
      mulfor6 = 1.0;
    } else if (val >= 10000.0) {
      mulfor6 = 1e1;
    } else if (val >= 1000.0) {
      mulfor6 = 1e2;
    } else if (val >= 100.0) {
      mulfor6 = 1e3;
    } else if (val >= 10.0) {
      mulfor6 = 1e4;
    } else if (val >= 1.0) {
      mulfor6 = 1e5;
    } else if (val >= 0.1) {
      mulfor6 = 1e6;
    } else if (val >= 0.01) {
      mulfor6 = 1e7;
    } else if (val >= 0.001) {
      mulfor6 = 1e8;
    } else if (val >= 0.0001) {
      mulfor6 = 1e9;
    }
    if (static_cast<float>(static_cast<int32_t>(val * mulfor6 + 0.5)) /
            mulfor6 ==
        val)
      return 6;
  } else if (val < 1e10) {
    FloatType divfor6 = 1.0;
    if (val >= 1e9) {  // 1,000,000,000 to 9,999,999,999
      divfor6 = 10000;
    } else if (val >= 1e8) {  // 100,000,000 to 999,999,999
      divfor6 = 1000;
    } else if (val >= 1e7) {  // 10,000,000 to 99,999,999
      divfor6 = 100;
    } else if (val >= 1e6) {  // 1,000,000 to 9,999,999
      divfor6 = 10;
    }
    if (static_cast<float>(static_cast<int32_t>(val / divfor6 + 0.5)) *
            divfor6 ==
        val)
      return 6;
  }
  return full;
}